

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool cJSON_AddItemReferenceToArray(cJSON *array,cJSON *item)

{
  byte *pbVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  char *pcVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  cJSON *pcVar9;
  
  if (item == (cJSON *)0x0 || array == (cJSON *)0x0) {
    return 0;
  }
  pcVar9 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar9 != (cJSON *)0x0) {
    pcVar9->valuedouble = 0.0;
    pcVar9->string = (char *)0x0;
    pcVar9->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar9->valueint = 0;
    pcVar9->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar9->type = 0;
    pcVar9->next = (cJSON *)0x0;
    pcVar9->prev = (cJSON *)0x0;
    pcVar2 = item->next;
    pcVar3 = item->prev;
    iVar5 = item->type;
    uVar6 = *(undefined4 *)&item->field_0x1c;
    pcVar4 = item->valuestring;
    iVar7 = item->valueint;
    uVar8 = *(undefined4 *)&item->field_0x2c;
    pcVar9->child = item->child;
    pcVar9->type = iVar5;
    *(undefined4 *)&pcVar9->field_0x1c = uVar6;
    pcVar9->next = pcVar2;
    pcVar9->prev = pcVar3;
    pcVar9->valuestring = pcVar4;
    pcVar9->valueint = iVar7;
    *(undefined4 *)&pcVar9->field_0x2c = uVar8;
    pcVar9->valuedouble = item->valuedouble;
    pbVar1 = (byte *)((long)&pcVar9->type + 1);
    *pbVar1 = *pbVar1 | 1;
    pcVar9->next = (cJSON *)0x0;
    pcVar9->prev = (cJSON *)0x0;
    if (pcVar9 == array) {
      return 0;
    }
    pcVar2 = array->child;
    if (pcVar2 == (cJSON *)0x0) {
      array->child = pcVar9;
      pcVar2 = pcVar9;
    }
    else {
      pcVar3 = pcVar2->prev;
      if (pcVar3 == (cJSON *)0x0) {
        return 1;
      }
      pcVar3->next = pcVar9;
      pcVar9->prev = pcVar3;
    }
    pcVar2->prev = pcVar9;
    return 1;
  }
  return 0;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_AddItemReferenceToArray(cJSON *array, cJSON *item)
{
    if (array == NULL)
    {
        return false;
    }

    return add_item_to_array(array, create_reference(item, &global_hooks));
}